

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvectorst.hpp
# Opt level: O3

void __thiscall
soplex::
SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  pointer pnVar1;
  undefined8 uVar2;
  Item *pIVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  bool bVar5;
  bool bVar6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  fpclass_type fVar16;
  byte bVar17;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar18;
  ulong uVar19;
  cpp_dec_float<200u,int,void> *pcVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  uint *puVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  uint *puVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  int32_t iVar26;
  byte bVar27;
  Real a;
  cpp_dec_float<200U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [13];
  undefined3 uStack_57b;
  int iStack_578;
  bool bStack_574;
  undefined8 local_570;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_560;
  SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_558;
  int local_54c;
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [13];
  undefined3 uStack_4db;
  int iStack_4d8;
  bool bStack_4d4;
  undefined8 local_4d0;
  long local_4c8;
  undefined8 uStack_4c0;
  int local_4ac;
  undefined1 local_4a8 [32];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [13];
  undefined3 uStack_43b;
  int iStack_438;
  bool bStack_434;
  undefined8 local_430;
  undefined1 local_428 [32];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [13];
  undefined3 uStack_3bb;
  int iStack_3b8;
  bool bStack_3b4;
  fpclass_type local_3b0;
  int iStack_3ac;
  undefined1 local_3a8 [32];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [13];
  undefined3 uStack_33b;
  int iStack_338;
  bool bStack_334;
  ulong local_330;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [13];
  undefined3 uStack_2bb;
  int iStack_2b8;
  bool bStack_2b4;
  undefined8 local_2b0;
  cpp_dec_float<200U,_int,_void> local_2a8;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  uint local_1c8 [3];
  undefined3 uStack_1bb;
  int iStack_1b8;
  bool bStack_1b4;
  ulong local_1b0;
  undefined1 local_1a8 [32];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [13];
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  cpp_dec_float<200U,_int,_void> local_11c;
  uint local_9c [27];
  
  bVar27 = 0;
  local_560 = base;
  local_558 = this;
  if (this->state == DVEC) {
    iVar10 = (int)((ulong)((long)(this->vec).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->vec).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 7);
    if ((base->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum != iVar10) goto LAB_0059a6ef;
    local_4d0._0_4_ = cpp_dec_float_finite;
    local_4d0._4_4_ = 0x1c;
    local_548 = (undefined1  [16])0x0;
    local_538 = (undefined1  [16])0x0;
    local_528 = (undefined1  [16])0x0;
    local_518 = (undefined1  [16])0x0;
    local_508 = (undefined1  [16])0x0;
    local_4f8 = (undefined1  [16])0x0;
    local_4e8 = SUB1613((undefined1  [16])0x0,0);
    uStack_4db = 0;
    iStack_4d8 = 0;
    bStack_4d4 = false;
    local_1b0 = 0x1c00000000;
    local_228 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    local_208 = (undefined1  [16])0x0;
    local_1f8 = (undefined1  [16])0x0;
    local_1e8 = (undefined1  [16])0x0;
    local_1d8 = (undefined1  [16])0x0;
    local_1c8[0] = 0;
    local_1c8[1] = 0;
    stack0xfffffffffffffe40 = 0;
    uStack_1bb = 0;
    iStack_1b8 = 0;
    bStack_1b4 = false;
    local_330 = 0x1c00000000;
    local_3a8._0_16_ = (undefined1  [16])0x0;
    local_3a8._16_16_ = (undefined1  [16])0x0;
    local_388 = (undefined1  [16])0x0;
    local_378 = (undefined1  [16])0x0;
    local_368 = (undefined1  [16])0x0;
    local_358 = (undefined1  [16])0x0;
    local_348 = SUB1613((undefined1  [16])0x0,0);
    uStack_33b = 0;
    iStack_338 = 0;
    bStack_334 = false;
    if (iVar10 != 0) {
      lVar11 = (long)iVar10;
      lVar13 = lVar11 << 7;
      do {
        pnVar1 = (this->vec).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar10 = *(int *)((long)&pnVar1[-1].m_backend.data + lVar13 + 0x70);
        bVar17 = *(byte *)((long)&pnVar1[-1].m_backend.data + lVar13 + 0x74);
        uVar2 = *(undefined8 *)((long)&pnVar1[-1].m_backend.data + lVar13 + 0x78);
        memmove((cpp_dec_float<200U,_int,_void> *)local_5e8,
                (void *)((long)&pnVar1[-1].m_backend.data + lVar13),0x70);
        this = local_558;
        bStack_574 = (bool)bVar17;
        if ((bVar17 == 1) && ((fpclass_type)uVar2 != cpp_dec_float_finite || local_5e8._0_4_ != 0))
        {
          bStack_574 = false;
        }
        lVar11 = lVar11 + -1;
        iStack_578 = iVar10;
        local_570 = uVar2;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  ((cpp_dec_float<200U,_int,_void> *)
                   ((long)&(local_558->
                           super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).rowWeight.data.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar13),
                   (cpp_dec_float<200U,_int,_void> *)local_5e8);
        lVar13 = lVar13 + -0x80;
      } while (lVar11 != 0);
    }
    lVar13 = (long)(local_560->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (lVar13 != 0) {
      pSVar18 = local_560;
      do {
        pIVar3 = (pSVar18->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar10 = (pSVar18->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[lVar13 + -1].idx;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)local_3a8,0);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_3a8;
        puVar22 = (uint *)local_228;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar22 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
          puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
        }
        iStack_1b8 = iStack_338;
        bStack_1b4 = bStack_334;
        local_1b0 = local_330;
        lVar11 = (long)pIVar3[iVar10].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        uVar19 = local_330;
        if (lVar11 != 0) {
          pIVar3 = pIVar3 + iVar10;
          lVar14 = lVar11 * 0x84;
          do {
            pNVar4 = (pIVar3->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            puVar22 = (uint *)((long)&pNVar4[-1].val.m_backend.data + lVar14);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_548;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar22;
              puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
            }
            iStack_4d8 = *(int *)((long)&(pNVar4->val).m_backend.data + lVar14 + -0x14);
            bStack_4d4 = *(bool *)((long)&(pNVar4->val).m_backend.data + lVar14 + -0x10);
            local_4d0 = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar14 + -0xc);
            pcVar12 = &(local_558->vec).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)&(((pIVar3->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .m_elem)->val).m_backend.data + lVar14 + -4)].m_backend;
            local_570._0_4_ = cpp_dec_float_finite;
            local_570._4_4_ = 0x1c;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = (undefined1  [16])0x0;
            local_5c8 = (undefined1  [16])0x0;
            local_5b8 = (undefined1  [16])0x0;
            local_5a8 = (undefined1  [16])0x0;
            local_598 = (undefined1  [16])0x0;
            local_588 = SUB1613((undefined1  [16])0x0,0);
            uStack_57b = 0;
            iStack_578 = 0;
            bStack_574 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_5e8 != pcVar12) {
              pcVar21 = pcVar12;
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar27 * -8 + 4)
                ;
              }
              iStack_578 = pcVar12->exp;
              bStack_574 = pcVar12->neg;
              local_570._0_4_ = pcVar12->fpclass;
              local_570._4_4_ = pcVar12->prec_elem;
            }
            lVar11 = lVar11 + -1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                       (cpp_dec_float<200U,_int,_void> *)local_548);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_228,
                       (cpp_dec_float<200U,_int,_void> *)local_5e8);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_548;
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pcVar21->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4);
            }
            iStack_578 = iStack_4d8;
            bStack_574 = bStack_4d4;
            local_570._0_4_ = (fpclass_type)local_4d0;
            local_570._4_4_ = local_4d0._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                       (cpp_dec_float<200U,_int,_void> *)local_548);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_3a8,
                       (cpp_dec_float<200U,_int,_void> *)local_5e8);
            lVar14 = lVar14 + -0x84;
          } while (lVar11 != 0);
          uVar19 = local_330 & 0xffffffff;
        }
        pSVar18 = local_560;
        lVar13 = lVar13 + -1;
        if ((int)uVar19 != 2) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,0,(type *)0x0);
          iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_3a8,
                              (cpp_dec_float<200U,_int,_void> *)local_5e8);
          if (0 < iVar10) {
            local_430._0_4_ = cpp_dec_float_finite;
            local_430._4_4_ = 0x1c;
            local_4a8._0_16_ = (undefined1  [16])0x0;
            local_4a8._16_16_ = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = (undefined1  [16])0x0;
            local_468 = (undefined1  [16])0x0;
            local_458 = (undefined1  [16])0x0;
            local_448 = SUB1613((undefined1  [16])0x0,0);
            uStack_43b = 0;
            iStack_438 = 0;
            bStack_434 = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)local_4a8,
                       (cpp_dec_float<200U,_int,_void> *)local_228,
                       (cpp_dec_float<200U,_int,_void> *)local_3a8);
            pcVar12 = &(pSVar18->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend;
            local_130._0_4_ = cpp_dec_float_finite;
            local_130._4_4_ = 0x1c;
            local_1a8._0_16_ = (undefined1  [16])0x0;
            local_1a8._16_16_ = (undefined1  [16])0x0;
            local_188 = (undefined1  [16])0x0;
            local_178 = (undefined1  [16])0x0;
            local_168 = (undefined1  [16])0x0;
            local_158 = (undefined1  [16])0x0;
            local_148 = SUB1613((undefined1  [16])0x0,0);
            uStack_13b = 0;
            iStack_138 = 0;
            bStack_134 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_1a8 == pcVar12) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_1a8,
                         (cpp_dec_float<200U,_int,_void> *)local_4a8);
              if (local_1a8._0_4_ == 0 && (fpclass_type)local_130 == cpp_dec_float_finite) {
                local_570._0_4_ = cpp_dec_float_finite;
              }
              else {
                bStack_134 = (bool)(bStack_134 ^ 1);
                local_570._0_4_ = (fpclass_type)local_130;
              }
            }
            else {
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)local_4a8;
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_1a8;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar23->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4)
                ;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar27 * -8 + 4)
                ;
              }
              iStack_138 = iStack_438;
              bStack_134 = bStack_434;
              local_130._0_4_ = (fpclass_type)local_430;
              local_130._4_4_ = local_430._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_1a8,pcVar12);
              local_570._0_4_ = (fpclass_type)local_130;
            }
            bVar8 = bStack_134;
            puVar22 = (uint *)local_1a8;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar22;
              puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
            }
            iStack_578 = iStack_138;
            local_570._4_4_ = local_130._4_4_;
            bStack_574 = bVar8;
            if (((bVar8 & 1U) != 0) &&
               ((fpclass_type)local_570 != cpp_dec_float_finite || local_5e8._0_4_ != 0)) {
              bStack_574 = (bool)(bVar8 ^ 1);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&(local_558->
                        super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).colWeight.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend,
                       (cpp_dec_float<200U,_int,_void> *)local_5e8);
          }
        }
      } while (lVar13 != 0);
    }
  }
  else {
    if ((this->state != PVEC) ||
       ((base->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum !=
        (int)((ulong)((long)(this->vec).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->vec).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 7))) {
LAB_0059a6ef:
      SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setupWeights(&this->
                      super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,base);
      return;
    }
    a = Tolerances::epsilon((base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    local_1b0._0_4_ = cpp_dec_float_finite;
    local_1b0._4_4_ = 0x1c;
    local_228 = ZEXT816(0);
    local_218 = ZEXT816(0);
    local_208 = ZEXT816(0);
    local_1f8 = ZEXT816(0);
    local_1e8 = ZEXT816(0);
    local_1d8 = ZEXT816(0);
    local_1c8[0] = 0;
    local_1c8[1] = 0;
    stack0xfffffffffffffe40 = 0;
    uStack_1bb = 0;
    iStack_1b8 = 0;
    bStack_1b4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_228,a);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_5e8,10000,(type *)0x0);
    pcVar20 = (cpp_dec_float<200u,int,void> *)local_228;
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_3a8;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pcVar12->data)._M_elems[0] = *(uint *)pcVar20;
      pcVar20 = pcVar20 + (ulong)bVar27 * -8 + 4;
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
    }
    iStack_338 = iStack_1b8;
    bStack_334 = bStack_1b4;
    local_330 = local_1b0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              ((cpp_dec_float<200U,_int,_void> *)local_3a8,
               (cpp_dec_float<200U,_int,_void> *)local_5e8);
    local_430 = 0x1c00000000;
    local_4a8._0_16_ = (undefined1  [16])0x0;
    local_4a8._16_16_ = (undefined1  [16])0x0;
    local_488 = (undefined1  [16])0x0;
    local_478 = (undefined1  [16])0x0;
    local_468 = (undefined1  [16])0x0;
    local_458 = (undefined1  [16])0x0;
    local_448 = SUB1613((undefined1  [16])0x0,0);
    uStack_43b = 0;
    iStack_438 = 0;
    bStack_434 = false;
    local_3b0 = cpp_dec_float_finite;
    iStack_3ac = 0x1c;
    local_428._0_16_ = (undefined1  [16])0x0;
    local_428._16_16_ = (undefined1  [16])0x0;
    local_408 = (undefined1  [16])0x0;
    local_3f8 = (undefined1  [16])0x0;
    local_3e8 = (undefined1  [16])0x0;
    local_3d8 = (undefined1  [16])0x0;
    local_3c8 = SUB1613((undefined1  [16])0x0,0);
    uStack_3bb = 0;
    iStack_3b8 = 0;
    bStack_3b4 = false;
    lVar13 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (lVar13 != 0) {
      lVar11 = lVar13 << 7;
      do {
        pnVar1 = (this->vec).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar1[-1].m_backend.data + lVar11);
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar11);
        local_570 = 0x1c00000000;
        local_5e8 = (undefined1  [16])0x0;
        local_5d8 = (undefined1  [16])0x0;
        local_5c8 = (undefined1  [16])0x0;
        local_5b8 = (undefined1  [16])0x0;
        local_5a8 = (undefined1  [16])0x0;
        local_598 = (undefined1  [16])0x0;
        local_588 = SUB1613((undefined1  [16])0x0,0);
        uStack_57b = 0;
        iStack_578 = 0;
        bStack_574 = false;
        if (pcVar21 == (cpp_dec_float<200U,_int,_void> *)local_5e8) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,pcVar12);
          if (local_5e8._0_4_ != 0 || (fpclass_type)local_570 != cpp_dec_float_finite) {
            bStack_574 = (bool)(bStack_574 ^ 1);
          }
        }
        else {
          if (pcVar12 != (cpp_dec_float<200U,_int,_void> *)local_5e8) {
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar27 * -8 + 4);
            }
            iStack_578 = *(int *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x70);
            bStack_574 = *(bool *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x74);
            local_570 = *(long *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x78);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,pcVar21);
        }
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
        puVar22 = (uint *)local_4a8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar22 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
          puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
        }
        iStack_438 = iStack_578;
        bStack_434 = bStack_574;
        local_430 = local_570;
        pnVar1 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar1[-1].m_backend.data + lVar11);
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(this->vec).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar11);
        local_570._0_4_ = cpp_dec_float_finite;
        local_570._4_4_ = 0x1c;
        local_5e8 = (undefined1  [16])0x0;
        local_5d8 = (undefined1  [16])0x0;
        local_5c8 = (undefined1  [16])0x0;
        local_5b8 = (undefined1  [16])0x0;
        local_5a8 = (undefined1  [16])0x0;
        local_598 = (undefined1  [16])0x0;
        local_588 = SUB1613((undefined1  [16])0x0,0);
        uStack_57b = 0;
        iStack_578 = 0;
        bStack_574 = false;
        if (pcVar21 == (cpp_dec_float<200U,_int,_void> *)local_5e8) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,pcVar12);
          if (local_5e8._0_4_ != 0 || (fpclass_type)local_570 != cpp_dec_float_finite) {
            bStack_574 = (bool)(bStack_574 ^ 1);
          }
        }
        else {
          if (pcVar12 != (cpp_dec_float<200U,_int,_void> *)local_5e8) {
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar27 * -8 + 4);
            }
            iStack_578 = *(int *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x70);
            bStack_574 = *(bool *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x74);
            local_570 = *(undefined8 *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x78);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,pcVar21);
        }
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
        puVar22 = (uint *)local_428;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar22 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
          puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
        }
        iStack_3b8 = iStack_578;
        bStack_3b4 = bStack_574;
        local_3b0 = (fpclass_type)local_570;
        iStack_3ac = local_570._4_4_;
        if (((fpclass_type)local_570 == cpp_dec_float_NaN ||
             (fpclass_type)local_430 == cpp_dec_float_NaN) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_4a8,
                               (cpp_dec_float<200U,_int,_void> *)local_428), lVar14 = local_430,
           iVar10 = iStack_438, base = local_560, -1 < iVar9)) {
          iVar10 = iStack_3ac;
          fVar16 = local_3b0;
          bVar8 = bStack_3b4;
          local_4c8 = CONCAT44(local_4c8._4_4_,iStack_3b8);
          uVar7 = local_428._0_4_;
          puVar22 = (uint *)(local_428 + 4);
          pcVar12 = &local_2a8;
          for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          bVar5 = local_3b0 != cpp_dec_float_finite;
          bVar6 = local_428._0_4_ != 0;
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(local_560->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .object.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar11);
          local_4d0._0_4_ = cpp_dec_float_finite;
          local_4d0._4_4_ = 0x1c;
          local_548 = (undefined1  [16])0x0;
          local_538 = (undefined1  [16])0x0;
          local_528 = (undefined1  [16])0x0;
          local_518 = (undefined1  [16])0x0;
          local_508 = (undefined1  [16])0x0;
          local_4f8 = (undefined1  [16])0x0;
          local_4e8 = SUB1613((undefined1  [16])0x0,0);
          uStack_4db = 0;
          iStack_4d8 = 0;
          bStack_4d4 = false;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_3a8;
          if (pcVar21 != (cpp_dec_float<200U,_int,_void> *)local_548) {
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_548;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar27 * -8 + 4);
            }
            iStack_4d8 = iStack_338;
            bStack_4d4 = bStack_334;
            local_4d0._0_4_ = (undefined4)local_330;
            local_4d0._4_4_ = local_330._4_4_;
            pcVar12 = pcVar21;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_548,pcVar12);
          local_5e8._0_4_ = uVar7;
          pcVar12 = &local_2a8;
          puVar22 = (uint *)(local_5e8 + 4);
          for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar22 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar27 * -2 + 1) * 4);
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
          }
          iStack_578 = (int)local_4c8;
          local_570._4_4_ = iVar10;
          local_570._0_4_ = fVar16;
          bStack_574 = (bool)(bVar8 ^ (bVar5 || bVar6));
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                     (cpp_dec_float<200U,_int,_void> *)local_548);
          pnVar1 = (local_558->
                   super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).colWeight.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
          puVar22 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar11);
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar22 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
          }
          *(int *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x70) = iStack_578;
          *(bool *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x74) = bStack_574;
          *(long *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x78) = local_570;
          bVar8 = true;
          base = local_560;
        }
        else {
          uVar7 = local_4a8._0_4_;
          puVar22 = (uint *)(local_4a8 + 4);
          pcVar12 = &local_2a8;
          for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          bVar17 = ((int)local_430 != 0 || local_4a8._0_4_ != 0) ^ bStack_434;
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(local_560->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .object.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar11);
          local_4d0._0_4_ = cpp_dec_float_finite;
          local_4d0._4_4_ = 0x1c;
          local_548 = (undefined1  [16])0x0;
          local_538 = (undefined1  [16])0x0;
          local_528 = (undefined1  [16])0x0;
          local_518 = (undefined1  [16])0x0;
          local_508 = (undefined1  [16])0x0;
          local_4f8 = (undefined1  [16])0x0;
          local_4e8 = SUB1613((undefined1  [16])0x0,0);
          uStack_4db = 0;
          iStack_4d8 = 0;
          bStack_4d4 = false;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_3a8;
          if (pcVar21 != (cpp_dec_float<200U,_int,_void> *)local_548) {
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_548;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar27 * -8 + 4);
            }
            iStack_4d8 = iStack_338;
            bStack_4d4 = bStack_334;
            local_4d0._0_4_ = (undefined4)local_330;
            local_4d0._4_4_ = local_330._4_4_;
            pcVar12 = pcVar21;
          }
          local_4c8 = lVar14;
          uStack_4c0 = 0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_548,pcVar12);
          local_5e8._0_4_ = uVar7;
          pcVar12 = &local_2a8;
          puVar22 = (uint *)(local_5e8 + 4);
          for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar22 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar27 * -2 + 1) * 4);
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
          }
          iStack_578 = iVar10;
          local_570 = local_4c8;
          bStack_574 = (bool)bVar17;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                     (cpp_dec_float<200U,_int,_void> *)local_548);
          pnVar1 = (local_558->
                   super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).colWeight.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
          puVar22 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar11);
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar22 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
          }
          *(int *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x70) = iStack_578;
          *(bool *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x74) = bStack_574;
          *(long *)((long)&pnVar1[-1].m_backend.data + lVar11 + 0x78) = local_570;
          bVar8 = false;
        }
        (local_558->
        super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).colUp.data[lVar13 + -1] = bVar8;
        lVar13 = lVar13 + -1;
        this = local_558;
        lVar11 = lVar11 + -0x80;
      } while (lVar13 != 0);
    }
    lVar13 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (lVar13 != 0) {
      do {
        pIVar3 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem +
                 (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[lVar13 + -1].idx;
        local_570._0_4_ = cpp_dec_float_finite;
        local_570._4_4_ = 0x1c;
        local_5e8 = (undefined1  [16])0x0;
        local_5d8 = (undefined1  [16])0x0;
        local_5c8 = (undefined1  [16])0x0;
        local_5b8 = (undefined1  [16])0x0;
        local_5a8 = (undefined1  [16])0x0;
        local_598 = (undefined1  [16])0x0;
        local_588 = SUB1613((undefined1  [16])0x0,0);
        uStack_57b = 0;
        iStack_578 = 0;
        bStack_574 = false;
        lVar11 = (long)(pIVar3->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        if (lVar11 < 1) {
          fVar16 = cpp_dec_float_finite;
          iVar26 = 0x1c;
          bVar17 = 0;
          iVar10 = 0;
        }
        else {
          uVar19 = lVar11 + 1;
          lVar11 = lVar11 * 0x84;
          do {
            pNVar4 = (pIVar3->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)&pNVar4[-1].val.m_backend.data + lVar11);
            pcVar23 = &(this->vec).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar4[-1].val + 1) + lVar11)].m_backend;
            local_4d0._0_4_ = cpp_dec_float_finite;
            local_4d0._4_4_ = 0x1c;
            local_548 = (undefined1  [16])0x0;
            local_538 = (undefined1  [16])0x0;
            local_528 = (undefined1  [16])0x0;
            local_518 = (undefined1  [16])0x0;
            local_508 = (undefined1  [16])0x0;
            local_4f8 = (undefined1  [16])0x0;
            local_4e8 = SUB1613((undefined1  [16])0x0,0);
            uStack_4db = 0;
            iStack_4d8 = 0;
            bStack_4d4 = false;
            pcVar12 = pcVar23;
            if ((pcVar21 != (cpp_dec_float<200U,_int,_void> *)local_548) &&
               (pcVar12 = pcVar21, (cpp_dec_float<200U,_int,_void> *)local_548 != pcVar23)) {
              pcVar21 = pcVar23;
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_548;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar25->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4)
                ;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar27 * -8 + 4)
                ;
              }
              iStack_4d8 = pcVar23->exp;
              bStack_4d4 = pcVar23->neg;
              local_4d0._0_4_ = pcVar23->fpclass;
              local_4d0._4_4_ = pcVar23->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_548,pcVar12);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                       (cpp_dec_float<200U,_int,_void> *)local_548);
            uVar19 = uVar19 - 1;
            lVar11 = lVar11 + -0x84;
          } while (1 < uVar19);
          fVar16 = (fpclass_type)local_570;
          iVar26 = local_570._4_4_;
          iVar10 = iStack_578;
          bVar17 = bStack_574;
        }
        lVar13 = lVar13 + -1;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)local_428;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar21->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4);
        }
        iStack_3b8 = iVar10;
        bStack_3b4 = (bool)bVar17;
        iStack_3ac = iVar26;
        local_3b0 = fVar16;
        local_4c8 = lVar13 * 0x80;
        pcVar12 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend;
        local_570._0_4_ = cpp_dec_float_finite;
        local_570._4_4_ = 0x1c;
        local_5e8 = (undefined1  [16])0x0;
        local_5d8 = (undefined1  [16])0x0;
        local_5c8 = (undefined1  [16])0x0;
        local_5b8 = (undefined1  [16])0x0;
        local_5a8 = (undefined1  [16])0x0;
        local_598 = (undefined1  [16])0x0;
        local_588 = SUB1613((undefined1  [16])0x0,0);
        uStack_57b = 0;
        iStack_578 = 0;
        bStack_574 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_5e8 == pcVar12) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                     (cpp_dec_float<200U,_int,_void> *)local_428);
          if (local_5e8._0_4_ == 0 && (fpclass_type)local_570 == cpp_dec_float_finite) {
            bStack_434 = bStack_574;
            fVar16 = cpp_dec_float_finite;
          }
          else {
            bStack_434 = (bool)(bStack_574 ^ 1);
            bStack_574 = bStack_434;
            fVar16 = (fpclass_type)local_570;
          }
        }
        else {
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)local_428;
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar23->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4);
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar27 * -8 + 4);
          }
          local_570._4_4_ = iVar26;
          local_570._0_4_ = fVar16;
          iStack_578 = iVar10;
          bStack_574 = (bool)bVar17;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,pcVar12);
          bStack_434 = bStack_574;
          fVar16 = (fpclass_type)local_570;
        }
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
        puVar22 = (uint *)local_4a8;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar22 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
          puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
        }
        iStack_438 = iStack_578;
        local_430 = CONCAT44(local_570._4_4_,fVar16);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(((base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .right.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + local_4c8)
        ;
        local_570._0_4_ = cpp_dec_float_finite;
        local_570._4_4_ = 0x1c;
        local_5e8 = (undefined1  [16])0x0;
        local_5d8 = (undefined1  [16])0x0;
        local_5c8 = (undefined1  [16])0x0;
        local_5b8 = (undefined1  [16])0x0;
        local_5a8 = (undefined1  [16])0x0;
        local_598 = (undefined1  [16])0x0;
        local_588 = SUB1613((undefined1  [16])0x0,0);
        uStack_57b = 0;
        iStack_578 = 0;
        bStack_574 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_5e8 != pcVar12) {
          pcVar21 = pcVar12;
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar23->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4);
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar27 * -8 + 4);
          }
          iStack_578 = pcVar12->exp;
          bStack_574 = pcVar12->neg;
          local_570._0_4_ = pcVar12->fpclass;
          local_570._4_4_ = pcVar12->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                   (cpp_dec_float<200U,_int,_void> *)local_428);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)local_428;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar21->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4);
        }
        iStack_3b8 = iStack_578;
        bStack_3b4 = bStack_574;
        local_3b0 = (fpclass_type)local_570;
        iStack_3ac = local_570._4_4_;
        if (((fpclass_type)local_570 == cpp_dec_float_NaN ||
             (fpclass_type)local_430 == cpp_dec_float_NaN) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_4a8,
                                (cpp_dec_float<200U,_int,_void> *)local_428), lVar11 = local_430,
           -1 < iVar10)) {
          fVar16 = local_3b0;
          local_4ac = iStack_3b8;
          local_54c = iStack_3ac;
          uVar7 = local_428._0_4_;
          puVar22 = (uint *)(local_428 + 4);
          puVar24 = local_9c;
          for (lVar11 = 0x1b; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar24 = *puVar22;
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
            puVar24 = puVar24 + (ulong)bVar27 * -2 + 1;
          }
          bVar17 = (local_428._0_4_ != 0 || local_3b0 != cpp_dec_float_finite) ^ bStack_3b4;
          local_2b0._0_4_ = cpp_dec_float_finite;
          local_2b0._4_4_ = 0x1c;
          local_328 = (undefined1  [16])0x0;
          local_318 = (undefined1  [16])0x0;
          local_308 = (undefined1  [16])0x0;
          local_2f8 = (undefined1  [16])0x0;
          local_2e8 = (undefined1  [16])0x0;
          local_2d8 = (undefined1  [16])0x0;
          local_2c8 = SUB1613((undefined1  [16])0x0,0);
          uStack_2bb = 0;
          iStack_2b8 = 0;
          bStack_2b4 = false;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                     (long)(pIVar3->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused,(type *)0x0);
          puVar22 = (uint *)local_228;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_328;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
          }
          iStack_2b8 = iStack_1b8;
          bStack_2b4 = bStack_1b4;
          local_2b0._0_4_ = (undefined4)local_1b0;
          local_2b0._4_4_ = local_1b0._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_328,
                     (cpp_dec_float<200U,_int,_void> *)local_5e8);
          local_2a8.data._M_elems[0] = uVar7;
          puVar22 = local_9c;
          puVar24 = local_2a8.data._M_elems + 1;
          for (lVar11 = 0x1b; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar24 = *puVar22;
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
            puVar24 = puVar24 + (ulong)bVar27 * -2 + 1;
          }
          local_2a8.exp = local_4ac;
          local_2a8.prec_elem = local_54c;
          local_2a8.fpclass = fVar16;
          local_2a8.neg = (bool)bVar17;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_2a8,(cpp_dec_float<200U,_int,_void> *)local_328);
          base = local_560;
          local_570._0_4_ = cpp_dec_float_finite;
          local_570._4_4_ = 0x1c;
          local_5e8 = (undefined1  [16])0x0;
          local_5d8 = (undefined1  [16])0x0;
          local_5c8 = (undefined1  [16])0x0;
          local_5b8 = (undefined1  [16])0x0;
          local_5a8 = (undefined1  [16])0x0;
          local_598 = (undefined1  [16])0x0;
          local_588 = SUB1613((undefined1  [16])0x0,0);
          uStack_57b = 0;
          iStack_578 = 0;
          bStack_574 = false;
          lVar11 = (long)(pIVar3->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
          if (0 < lVar11) {
            uVar19 = lVar11 + 1;
            lVar11 = lVar11 * 0x84;
            do {
              pNVar4 = (pIVar3->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)&pNVar4[-1].val.m_backend.data + lVar11);
              pcVar23 = &(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar4[-1].val + 1) + lVar11)].m_backend;
              local_4d0._0_4_ = cpp_dec_float_finite;
              local_4d0._4_4_ = 0x1c;
              local_548 = (undefined1  [16])0x0;
              local_538 = (undefined1  [16])0x0;
              local_528 = (undefined1  [16])0x0;
              local_518 = (undefined1  [16])0x0;
              local_508 = (undefined1  [16])0x0;
              local_4f8 = (undefined1  [16])0x0;
              local_4e8 = SUB1613((undefined1  [16])0x0,0);
              uStack_4db = 0;
              iStack_4d8 = 0;
              bStack_4d4 = false;
              pcVar12 = pcVar23;
              if ((pcVar21 != (cpp_dec_float<200U,_int,_void> *)local_548) &&
                 (pcVar12 = pcVar21, (cpp_dec_float<200U,_int,_void> *)local_548 != pcVar23)) {
                pcVar21 = pcVar23;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_548;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar25->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
                  pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar21 + (ulong)bVar27 * -8 + 4);
                  pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar25 + (ulong)bVar27 * -8 + 4);
                }
                iStack_4d8 = pcVar23->exp;
                bStack_4d4 = pcVar23->neg;
                local_4d0._0_4_ = pcVar23->fpclass;
                local_4d0._4_4_ = pcVar23->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_548,pcVar12);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                         (cpp_dec_float<200U,_int,_void> *)local_548);
              uVar19 = uVar19 - 1;
              lVar11 = lVar11 + -0x84;
            } while (1 < uVar19);
          }
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
          pcVar21 = &local_11c;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar21->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4);
          }
          local_11c.exp = iStack_578;
          local_11c.neg = bStack_574;
          local_11c.fpclass = (fpclass_type)local_570;
          local_11c.prec_elem = local_570._4_4_;
          puVar22 = (uint *)local_3a8;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_548;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
          }
          iStack_4d8 = iStack_338;
          bStack_4d4 = bStack_334;
          local_4d0._0_4_ = (undefined4)local_330;
          local_4d0._4_4_ = local_330._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_548,&local_11c);
          pcVar12 = &local_2a8;
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar21->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar27 * -2 + 1) * 4);
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4);
          }
          iStack_578 = local_2a8.exp;
          bStack_574 = local_2a8.neg;
          local_570._0_4_ = local_2a8.fpclass;
          local_570._4_4_ = local_2a8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                     (cpp_dec_float<200U,_int,_void> *)local_548);
          pnVar1 = (local_558->
                   super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).rowWeight.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
          puVar22 = (uint *)((long)&(pnVar1->m_backend).data + local_4c8);
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar22 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
          }
          *(int *)((long)&(pnVar1->m_backend).data + local_4c8 + 0x70) = iStack_578;
          *(bool *)((long)&(pnVar1->m_backend).data + local_4c8 + 0x74) = bStack_574;
          *(long *)((long)&(pnVar1->m_backend).data + local_4c8 + 0x78) = local_570;
          bVar8 = true;
          this = local_558;
        }
        else {
          uVar7 = local_4a8._0_4_;
          puVar22 = (uint *)(local_4a8 + 4);
          puVar24 = local_9c;
          for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar24 = *puVar22;
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
            puVar24 = puVar24 + (ulong)bVar27 * -2 + 1;
          }
          bVar17 = (local_4a8._0_4_ != 0 || (int)local_430 != 0) ^ bStack_434;
          local_54c = iStack_438;
          local_2b0._0_4_ = cpp_dec_float_finite;
          local_2b0._4_4_ = 0x1c;
          local_328 = (undefined1  [16])0x0;
          local_318 = (undefined1  [16])0x0;
          local_308 = (undefined1  [16])0x0;
          local_2f8 = (undefined1  [16])0x0;
          local_2e8 = (undefined1  [16])0x0;
          local_2d8 = (undefined1  [16])0x0;
          local_2c8 = SUB1613((undefined1  [16])0x0,0);
          uStack_2bb = 0;
          iStack_2b8 = 0;
          bStack_2b4 = false;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                     (long)(pIVar3->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused,(type *)0x0);
          puVar22 = (uint *)local_228;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_328;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
          }
          iStack_2b8 = iStack_1b8;
          bStack_2b4 = bStack_1b4;
          local_2b0._0_4_ = (undefined4)local_1b0;
          local_2b0._4_4_ = local_1b0._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_328,
                     (cpp_dec_float<200U,_int,_void> *)local_5e8);
          lVar14 = local_430;
          local_2a8.data._M_elems[0] = uVar7;
          puVar22 = local_9c;
          puVar24 = local_2a8.data._M_elems + 1;
          for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar24 = *puVar22;
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
            puVar24 = puVar24 + (ulong)bVar27 * -2 + 1;
          }
          local_2a8.exp = local_54c;
          local_430._0_4_ = (fpclass_type)lVar11;
          local_430._4_4_ = SUB84(lVar11,4);
          local_2a8.fpclass = (fpclass_type)local_430;
          local_2a8.prec_elem = local_430._4_4_;
          local_430 = lVar14;
          local_2a8.neg = (bool)bVar17;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_2a8,(cpp_dec_float<200U,_int,_void> *)local_328);
          this = local_558;
          base = local_560;
          local_570._0_4_ = cpp_dec_float_finite;
          local_570._4_4_ = 0x1c;
          local_5e8 = (undefined1  [16])0x0;
          local_5d8 = (undefined1  [16])0x0;
          local_5c8 = (undefined1  [16])0x0;
          local_5b8 = (undefined1  [16])0x0;
          local_5a8 = (undefined1  [16])0x0;
          local_598 = (undefined1  [16])0x0;
          local_588 = SUB1613((undefined1  [16])0x0,0);
          uStack_57b = 0;
          iStack_578 = 0;
          bStack_574 = false;
          lVar11 = (long)(pIVar3->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
          if (0 < lVar11) {
            uVar19 = lVar11 + 1;
            lVar11 = lVar11 * 0x84;
            do {
              pNVar4 = (pIVar3->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)&pNVar4[-1].val.m_backend.data + lVar11);
              pcVar23 = &(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar4[-1].val + 1) + lVar11)].m_backend;
              local_4d0._0_4_ = cpp_dec_float_finite;
              local_4d0._4_4_ = 0x1c;
              local_548 = (undefined1  [16])0x0;
              local_538 = (undefined1  [16])0x0;
              local_528 = (undefined1  [16])0x0;
              local_518 = (undefined1  [16])0x0;
              local_508 = (undefined1  [16])0x0;
              local_4f8 = (undefined1  [16])0x0;
              local_4e8 = SUB1613((undefined1  [16])0x0,0);
              uStack_4db = 0;
              iStack_4d8 = 0;
              bStack_4d4 = false;
              pcVar12 = pcVar23;
              if ((pcVar21 != (cpp_dec_float<200U,_int,_void> *)local_548) &&
                 (pcVar12 = pcVar21, (cpp_dec_float<200U,_int,_void> *)local_548 != pcVar23)) {
                pcVar21 = pcVar23;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_548;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar25->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
                  pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar21 + (ulong)bVar27 * -8 + 4);
                  pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar25 + (ulong)bVar27 * -8 + 4);
                }
                iStack_4d8 = pcVar23->exp;
                bStack_4d4 = pcVar23->neg;
                local_4d0._0_4_ = pcVar23->fpclass;
                local_4d0._4_4_ = pcVar23->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_548,pcVar12);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                         (cpp_dec_float<200U,_int,_void> *)local_548);
              uVar19 = uVar19 - 1;
              lVar11 = lVar11 + -0x84;
            } while (1 < uVar19);
          }
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
          pcVar21 = &local_11c;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar21->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4);
          }
          local_11c.exp = iStack_578;
          local_11c.neg = bStack_574;
          local_11c.fpclass = (fpclass_type)local_570;
          local_11c.prec_elem = local_570._4_4_;
          puVar22 = (uint *)local_3a8;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_548;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar22;
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
          }
          iStack_4d8 = iStack_338;
          bStack_4d4 = bStack_334;
          local_4d0._0_4_ = (undefined4)local_330;
          local_4d0._4_4_ = local_330._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_548,&local_11c);
          pcVar12 = &local_2a8;
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar21->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar12 + ((ulong)bVar27 * -2 + 1) * 4);
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar27 * -8 + 4);
          }
          iStack_578 = local_2a8.exp;
          bStack_574 = local_2a8.neg;
          local_570._0_4_ = local_2a8.fpclass;
          local_570._4_4_ = local_2a8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_5e8,
                     (cpp_dec_float<200U,_int,_void> *)local_548);
          pnVar1 = (this->
                   super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).rowWeight.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_5e8;
          puVar22 = (uint *)((long)&(pnVar1->m_backend).data + local_4c8);
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar22 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar27 * -8 + 4);
            puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
          }
          *(int *)((long)&(pnVar1->m_backend).data + local_4c8 + 0x70) = iStack_578;
          *(bool *)((long)&(pnVar1->m_backend).data + local_4c8 + 0x74) = bStack_574;
          *(long *)((long)&(pnVar1->m_backend).data + local_4c8 + 0x78) = local_570;
          bVar8 = false;
        }
        (this->
        super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).rowRight.data[lVar13] = bVar8;
      } while (lVar13 != 0);
    }
  }
  return;
}

Assistant:

void SPxVectorST<R>::setupWeights(SPxSolverBase<R>& base)
{
   if(state == PVEC)
   {
      if(vec.dim() != base.nCols())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      const VectorBase<R>& obj = base.maxObj();
      R eps = base.epsilon();
      R bias = 10000 * eps;
      R x, y;
      int i;

      SPxOut::debug(this, "DVECST01 colWeight[]: ");

      for(i = base.nCols(); i--;)
      {
         x = vec[i] - base.SPxLPBase<R>::lower(i);
         y = base.SPxLPBase<R>::upper(i) - vec[i];

         if(x < y)
         {
            this->colWeight[i] = -x - bias * obj[i];
            this->colUp[i] = 0;
         }
         else
         {
            this->colWeight[i] = -y + bias * obj[i];
            this->colUp[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->colWeight[i]);
      }

      SPxOut::debug(this, "\n \n");

      SPxOut::debug(this, "DVECST02 rowWeight[]: ");

      for(i = base.nRows(); i--;)
      {
         const SVectorBase<R>& row = base.rowVector(i);
         y = vec * row;
         x = (y - base.lhs(i));
         y = (base.rhs(i) - y);

         if(x < y)
         {
            this->rowWeight[i] = -x - eps * row.size() - bias * (obj * row);
            this->rowRight[i] = 0;
         }
         else
         {
            this->rowWeight[i] = -y - eps * row.size() + bias * (obj * row);
            this->rowRight[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->rowWeight[i]);
      }

      SPxOut::debug(this, "\n");
   }

   else if(state == DVEC)
   {
      if(vec.dim() != base.nRows())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      R x, y, len;
      int i, j;

      for(i = base.nRows(); i--;)
         this->rowWeight[i] += spxAbs(vec[i]);

      for(i = base.nCols(); i--;)
      {
         const SVectorBase<R>& col = base.colVector(i);

         for(y = len = 0, j = col.size(); j--;)
         {
            x = col.value(j);
            y += vec[col.index(j)] * x;
            len += x * x;
         }

         if(len > 0)
            this->colWeight[i] += spxAbs(y / len - base.maxObj(i));
      }
   }
   else
      SPxWeightST<R>::setupWeights(base);
}